

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_args(GlobalConfig *config,int argc,char **argv)

{
  int iVar1;
  OperationConfig *pOVar2;
  char *pcVar3;
  char *local_78;
  char *reason;
  char *pcStack_58;
  _Bool used;
  char *nextarg;
  char *flag;
  OperationConfig *pOStack_40;
  _Bool passarg;
  OperationConfig *operation;
  char *pcStack_30;
  ParameterError result;
  char *orig_opt;
  _Bool stillflags;
  char **ppcStack_20;
  int i;
  char **argv_local;
  GlobalConfig *pGStack_10;
  int argc_local;
  GlobalConfig *config_local;
  
  pcStack_30 = (char *)0x0;
  operation._4_4_ = PARAM_OK;
  pOStack_40 = config->first;
  orig_opt._3_1_ = 1;
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pGStack_10 = config;
  for (orig_opt._4_4_ = 1; orig_opt._4_4_ < argv_local._4_4_ && operation._4_4_ == PARAM_OK;
      orig_opt._4_4_ = orig_opt._4_4_ + 1) {
    pcStack_30 = ppcStack_20[orig_opt._4_4_];
    if (((orig_opt._3_1_ & 1) == 0) || (*ppcStack_20[orig_opt._4_4_] != '-')) {
      operation._4_4_ =
           getparameter("--url",ppcStack_20[orig_opt._4_4_],(_Bool *)((long)&reason + 7),pGStack_10,
                        pOStack_40);
    }
    else {
      nextarg = ppcStack_20[orig_opt._4_4_];
      iVar1 = strcmp("--",ppcStack_20[orig_opt._4_4_]);
      if (iVar1 == 0) {
        orig_opt._3_1_ = 0;
      }
      else {
        if (orig_opt._4_4_ < argv_local._4_4_ + -1) {
          local_78 = ppcStack_20[orig_opt._4_4_ + 1];
        }
        else {
          local_78 = (char *)0x0;
        }
        pcStack_58 = local_78;
        operation._4_4_ =
             getparameter(nextarg,local_78,(_Bool *)((long)&flag + 7),pGStack_10,pOStack_40);
        if (operation._4_4_ == PARAM_NEXT_OPERATION) {
          operation._4_4_ = PARAM_OK;
          if ((pOStack_40->url_list != (getout *)0x0) && (pOStack_40->url_list->url != (char *)0x0))
          {
            pOVar2 = (OperationConfig *)malloc(0x4a8);
            pOStack_40->next = pOVar2;
            if (pOStack_40->next == (OperationConfig *)0x0) {
              operation._4_4_ = PARAM_NO_MEM;
            }
            else {
              config_init(pOStack_40->next);
              pOStack_40->next->easy = pGStack_10->easy;
              pOStack_40->next->global = pGStack_10;
              pGStack_10->last = pOStack_40->next;
              pOStack_40->next->prev = pOStack_40;
              pOStack_40 = pOStack_40->next;
            }
          }
        }
        else if ((operation._4_4_ == PARAM_OK) && ((flag._7_1_ & 1) != 0)) {
          orig_opt._4_4_ = orig_opt._4_4_ + 1;
        }
      }
    }
  }
  if ((((operation._4_4_ != PARAM_OK) && (operation._4_4_ != PARAM_HELP_REQUESTED)) &&
      (operation._4_4_ != PARAM_MANUAL_REQUESTED)) &&
     ((operation._4_4_ != PARAM_VERSION_INFO_REQUESTED &&
      (operation._4_4_ != PARAM_ENGINES_REQUESTED)))) {
    pcVar3 = param2text(operation._4_4_);
    if ((pcStack_30 == (char *)0x0) || (iVar1 = strcmp(":",pcStack_30), iVar1 == 0)) {
      helpf(pGStack_10->errors,"%s\n",pcVar3);
    }
    else {
      helpf(pGStack_10->errors,"option %s: %s\n",pcStack_30,pcVar3);
    }
  }
  return operation._4_4_;
}

Assistant:

ParameterError parse_args(struct GlobalConfig *config, int argc,
                          argv_item_t argv[])
{
  int i;
  bool stillflags;
  char *orig_opt = NULL;
  ParameterError result = PARAM_OK;
  struct OperationConfig *operation = config->first;

  for(i = 1, stillflags = TRUE; i < argc && !result; i++) {
    orig_opt = argv[i];

    if(stillflags && ('-' == argv[i][0])) {
      bool passarg;
      char *flag = argv[i];

      if(!strcmp("--", argv[i]))
        /* This indicates the end of the flags and thus enables the
           following (URL) argument to start with -. */
        stillflags = FALSE;
      else {
        char *nextarg = (i < (argc - 1)) ? argv[i + 1] : NULL;

        result = getparameter(flag, nextarg, &passarg, config, operation);
        if(result == PARAM_NEXT_OPERATION) {
          /* Reset result as PARAM_NEXT_OPERATION is only used here and not
             returned from this function */
          result = PARAM_OK;

          if(operation->url_list && operation->url_list->url) {
            /* Allocate the next config */
            operation->next = malloc(sizeof(struct OperationConfig));
            if(operation->next) {
              /* Initialise the newly created config */
              config_init(operation->next);

              /* Copy the easy handle */
              operation->next->easy = config->easy;

              /* Set the global config pointer */
              operation->next->global = config;

              /* Update the last operation pointer */
              config->last = operation->next;

              /* Move onto the new config */
              operation->next->prev = operation;
              operation = operation->next;
            }
            else
              result = PARAM_NO_MEM;
          }
        }
        else if(!result && passarg)
          i++; /* we're supposed to skip this */
      }
    }
    else {
      bool used;

      /* Just add the URL please */
      result = getparameter((char *)"--url", argv[i], &used, config,
                            operation);
    }
  }

  if(result && result != PARAM_HELP_REQUESTED &&
     result != PARAM_MANUAL_REQUESTED &&
     result != PARAM_VERSION_INFO_REQUESTED &&
     result != PARAM_ENGINES_REQUESTED) {
    const char *reason = param2text(result);

    if(orig_opt && strcmp(":", orig_opt))
      helpf(config->errors, "option %s: %s\n", orig_opt, reason);
    else
      helpf(config->errors, "%s\n", reason);
  }

  return result;
}